

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

ON_SubDFaceParameter * __thiscall
ON_SubDMeshFragment::VertexSubDFaceParameter
          (ON_SubDFaceParameter *__return_storage_ptr__,ON_SubDMeshFragment *this,uint grid2dex_i,
          uint grid2dex_j)

{
  undefined4 uVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  uint local_8c;
  ON_SubDFaceCornerDex local_6c;
  double dStack_68;
  ON_SubDFaceCornerDex cdex;
  double corner_t;
  double corner_s;
  double gdelta;
  double quad_t;
  double quad_s;
  double gdelta_1;
  uint face_edge_count;
  uint gc;
  ON_3dPoint debugP;
  uint grid2dex_j_local;
  uint grid2dex_i_local;
  ON_SubDMeshFragment *this_local;
  
  debugP.z._0_4_ = grid2dex_j;
  debugP.z._4_4_ = grid2dex_i;
  VertexPoint((ON_3dPoint *)&face_edge_count,this,grid2dex_i,grid2dex_j);
  bVar2 = ON_3dPoint::IsValid((ON_3dPoint *)&face_edge_count);
  if ((((bVar2) && (uVar3 = ON_SubDMeshFragmentGrid::SideSegmentCount(&this->m_grid), uVar3 != 0))
      && (debugP.z._4_4_ <= uVar3)) && (debugP.z._0_4_ <= uVar3)) {
    if (this->m_face_fragment_count == 1) {
      local_8c = 4;
    }
    else {
      local_8c = (uint)this->m_face_fragment_count;
    }
    if (2 < local_8c) {
      if (local_8c == 4) {
        if (this->m_face_fragment_index != 0) goto LAB_008dd1f6;
        ON_SubDFaceParameter::CreateFromQuadFaceParameteters
                  (__return_storage_ptr__,(1.0 / (double)uVar3) * (double)debugP.z._4_4_,
                   (1.0 / (double)uVar3) * (double)debugP.z._0_4_);
        bVar2 = ON_SubDFaceParameter::IsNotSet(__return_storage_ptr__);
      }
      else {
        if (local_8c <= this->m_face_fragment_index) goto LAB_008dd1f6;
        uVar4 = (ulong)debugP.z._4_4_;
        dStack_68 = -(0.5 / (double)uVar3) * (double)debugP.z._0_4_ + 0.5;
        ON_SubDFaceCornerDex::ON_SubDFaceCornerDex
                  (&local_6c,(uint)this->m_face_fragment_index,local_8c);
        ON_SubDFaceParameter::ON_SubDFaceParameter
                  (__return_storage_ptr__,local_6c,0.5 - (0.5 / (double)uVar3) * (double)uVar4,
                   dStack_68);
        bVar2 = ON_SubDFaceParameter::IsNotSet(__return_storage_ptr__);
      }
      if (!bVar2) {
        ON_SubDFaceParameter::Nan.m_cdex = ON_SubDFaceParameter::Nan.m_cdex;
        ON_SubDFaceParameter::Nan._4_4_ = ON_SubDFaceParameter::Nan._4_4_;
        return __return_storage_ptr__;
      }
    }
  }
LAB_008dd1f6:
  uVar1 = ON_SubDFaceParameter::Nan._4_4_;
  __return_storage_ptr__->m_cdex = ON_SubDFaceParameter::Nan.m_cdex;
  *(undefined4 *)&__return_storage_ptr__->field_0x4 = uVar1;
  __return_storage_ptr__->m_s = ON_SubDFaceParameter::Nan.m_s;
  __return_storage_ptr__->m_t = ON_SubDFaceParameter::Nan.m_t;
  return __return_storage_ptr__;
}

Assistant:

const ON_SubDFaceParameter ON_SubDMeshFragment::VertexSubDFaceParameter(
  unsigned grid2dex_i,
  unsigned grid2dex_j
) const
{
  for (;;)
  {
    const ON_3dPoint debugP = VertexPoint(grid2dex_i, grid2dex_j);
    if (false == debugP.IsValid())
      break;


    const unsigned gc = m_grid.SideSegmentCount();
    if (gc < 1)
      break;
    if (grid2dex_i > gc || grid2dex_j > gc)
      break;

    // quad faces have m_face_fragment_count = 1;
    // n-gon faces have m_face_fragment_count = n (n = 3 or n >= 5)
    const unsigned face_edge_count 
      = (1 == m_face_fragment_count) 
      ? 4u
      : ((unsigned)m_face_fragment_count);

    if (face_edge_count < 3)
      break;

    if (4 == face_edge_count)
    {
      // quad face
      if (0 != m_face_fragment_index)
        break;
      // quad parameters run from 0.0 to 1.0.
      const double gdelta = 1.0 / ((double)gc);
      const double quad_s = gdelta * grid2dex_i;
      const double quad_t = gdelta * grid2dex_j;
      const ON_SubDFaceParameter p = ON_SubDFaceParameter::CreateFromQuadFaceParameteters(quad_s, quad_t);
      if (p.IsNotSet())
        break;
      return p;
    }

    // ngon face
    if (0 != m_face_fragment_index >= face_edge_count)
      break;
    // corner parameters run from 0.0 to 0.5.
    const double gdelta = 0.5 / ((double)gc);
    const double corner_s = 0.5 - gdelta * grid2dex_i;
    const double corner_t = 0.5 - gdelta * grid2dex_j;
    const ON_SubDFaceCornerDex cdex(m_face_fragment_index, face_edge_count);
    const ON_SubDFaceParameter p(cdex, corner_s, corner_t);
    if (p.IsNotSet())
      break;
    return p;
  }

  return ON_SubDFaceParameter::Nan;
}